

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

_Bool tval_can_be_artifact_k(object_kind *kind)

{
  object_kind *kind_local;
  
  if ((kind->tval == 5) || (kind->tval - 7U < 0xc)) {
    kind_local._7_1_ = true;
  }
  else {
    kind_local._7_1_ = false;
  }
  return kind_local._7_1_;
}

Assistant:

bool tval_can_be_artifact_k(const struct object_kind *kind)
{
	switch (kind->tval) {
		case TV_BOW:
		case TV_HAFTED:
		case TV_POLEARM:
		case TV_SWORD:
		case TV_BOOTS:
		case TV_GLOVES:
		case TV_HELM:
		case TV_CROWN:
		case TV_SHIELD:
		case TV_CLOAK:
		case TV_SOFT_ARMOR:
		case TV_HARD_ARMOR:
		case TV_DRAG_ARMOR:
			return true;
		default:
			return false;
	}
}